

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::_setToDoubleFast(DecimalQuantity *this,double n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  
  this->isApproximate = '\x01';
  this->origDouble = n;
  this->origDelta = 0;
  uVar2 = (uint)((ulong)n >> 0x34) & 0x7ff;
  if (uVar2 < 0x434) {
    dVar5 = (double)(long)n;
    if ((dVar5 == n) && (!NAN(dVar5) && !NAN(n))) {
      _setToLong(this,(long)n);
      return;
    }
  }
  uVar2 = (uint)((double)(int)(0x433 - uVar2) / 3.32192809489);
  if ((int)uVar2 < 0) {
    uVar4 = uVar2;
    uVar3 = uVar2;
    if ((int)uVar2 < -0x15) {
      do {
        n = n / 1e+22;
        uVar3 = uVar4 + 0x16;
        bVar1 = (int)uVar4 < -0x2b;
        uVar4 = uVar3;
      } while (bVar1);
    }
    dVar5 = n / *(double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (ulong)-uVar3 * 8);
  }
  else {
    uVar4 = uVar2;
    uVar3 = uVar2;
    if (0x15 < (int)uVar2) {
      do {
        n = n * 1e+22;
        uVar3 = uVar4 - 0x16;
        bVar1 = 0x2b < (int)uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
    dVar5 = n * *(double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (ulong)uVar3 * 8);
  }
  dVar5 = round(dVar5);
  if ((long)dVar5 != 0) {
    _setToLong(this,(long)dVar5);
    this->scale = this->scale - uVar2;
  }
  return;
}

Assistant:

void DecimalQuantity::_setToDoubleFast(double n) {
    isApproximate = true;
    origDouble = n;
    origDelta = 0;

    // Make sure the double is an IEEE 754 double.  If not, fall back to the slow path right now.
    // TODO: Make a fast path for other types of doubles.
    if (!std::numeric_limits<double>::is_iec559) {
        convertToAccurateDouble();
        // Turn off the approximate double flag, since the value is now exact.
        isApproximate = false;
        origDouble = 0.0;
        return;
    }

    // To get the bits from the double, use memcpy, which takes care of endianness.
    uint64_t ieeeBits;
    uprv_memcpy(&ieeeBits, &n, sizeof(n));
    int32_t exponent = static_cast<int32_t>((ieeeBits & 0x7ff0000000000000L) >> 52) - 0x3ff;

    // Not all integers can be represented exactly for exponent > 52
    if (exponent <= 52 && static_cast<int64_t>(n) == n) {
        _setToLong(static_cast<int64_t>(n));
        return;
    }

    // 3.3219... is log2(10)
    auto fracLength = static_cast<int32_t> ((52 - exponent) / 3.32192809489);
    if (fracLength >= 0) {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i >= 22; i -= 22) n *= 1e22;
        n *= DOUBLE_MULTIPLIERS[i];
    } else {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i <= -22; i += 22) n /= 1e22;
        n /= DOUBLE_MULTIPLIERS[-i];
    }
    auto result = static_cast<int64_t>(std::round(n));
    if (result != 0) {
        _setToLong(result);
        scale -= fracLength;
    }
}